

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

Vec_Ptr_t * Llb_ManFlowCompute(Aig_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Vec_Ptr_t *p_00;
  int local_30;
  int i;
  int RetValue;
  int FlowCur;
  int Flow;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vMinCut;
  Aig_Man_t *p_local;
  
  RetValue = 0;
  Aig_ManCleanData(p);
  Aig_ManIncrementTravId(p);
  for (local_30 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_30 < iVar1; local_30 = local_30 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_30);
    if ((pAVar2 != (Aig_Obj_t *)0x0) && ((*(ulong *)&pAVar2->field_0x18 >> 5 & 1) != 0)) {
      if ((*(ulong *)&pAVar2->field_0x18 >> 4 & 1) != 0) {
        __assert_fail("!pObj->fMarkA",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Flow.c"
                      ,0x34b,"Vec_Ptr_t *Llb_ManFlowCompute(Aig_Man_t *)");
      }
      pAVar3 = Aig_ObjFanin0(pAVar2);
      if ((*(ulong *)&pAVar3->field_0x18 >> 5 & 1) == 0) {
        pAVar3 = Aig_ObjFanin0(pAVar2);
        iVar1 = Llb_ManFlowBwdPath2_rec(p,pAVar3);
        RetValue = iVar1 + RetValue;
        if (iVar1 != 0) {
          Aig_ManIncrementTravId(p);
        }
      }
      iVar1 = Aig_ObjIsNode(pAVar2);
      if ((iVar1 != 0) &&
         (pAVar3 = Aig_ObjFanin1(pAVar2), (*(ulong *)&pAVar3->field_0x18 >> 5 & 1) == 0)) {
        pAVar2 = Aig_ObjFanin1(pAVar2);
        iVar1 = Llb_ManFlowBwdPath2_rec(p,pAVar2);
        RetValue = iVar1 + RetValue;
        if (iVar1 != 0) {
          Aig_ManIncrementTravId(p);
        }
      }
    }
  }
  Aig_ManIncrementTravId(p);
  local_30 = 0;
  do {
    iVar1 = Vec_PtrSize(p->vObjs);
    if (iVar1 <= local_30) {
      p_00 = Llb_ManFlowMinCut(p);
      iVar1 = Vec_PtrSize(p_00);
      if (iVar1 == RetValue) {
        Llb_ManFlowUpdateCut(p,p_00);
        iVar1 = Llb_ManFlowVerifyCut(p,p_00);
        if (iVar1 == 0) {
          printf("Llb_ManFlow() error! The computed min-cut is not a cut!\n");
        }
        return p_00;
      }
      __assert_fail("Vec_PtrSize(vMinCut) == Flow",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Flow.c"
                    ,0x373,"Vec_Ptr_t *Llb_ManFlowCompute(Aig_Man_t *)");
    }
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_30);
    if ((pAVar2 != (Aig_Obj_t *)0x0) && ((*(ulong *)&pAVar2->field_0x18 >> 5 & 1) != 0)) {
      if ((*(ulong *)&pAVar2->field_0x18 >> 4 & 1) != 0) {
        __assert_fail("!pObj->fMarkA",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Flow.c"
                      ,0x365,"Vec_Ptr_t *Llb_ManFlowCompute(Aig_Man_t *)");
      }
      pAVar3 = Aig_ObjFanin0(pAVar2);
      if ((*(ulong *)&pAVar3->field_0x18 >> 5 & 1) == 0) {
        pAVar3 = Aig_ObjFanin0(pAVar2);
        iVar1 = Llb_ManFlowBwdPath2_rec(p,pAVar3);
        if (iVar1 != 0) {
          __assert_fail("RetValue == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Flow.c"
                        ,0x369,"Vec_Ptr_t *Llb_ManFlowCompute(Aig_Man_t *)");
        }
      }
      iVar1 = Aig_ObjIsNode(pAVar2);
      if ((iVar1 != 0) &&
         (pAVar3 = Aig_ObjFanin1(pAVar2), (*(ulong *)&pAVar3->field_0x18 >> 5 & 1) == 0)) {
        pAVar2 = Aig_ObjFanin1(pAVar2);
        iVar1 = Llb_ManFlowBwdPath2_rec(p,pAVar2);
        if (iVar1 != 0) {
          __assert_fail("RetValue == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Flow.c"
                        ,0x36e,"Vec_Ptr_t *Llb_ManFlowCompute(Aig_Man_t *)");
        }
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Llb_ManFlowCompute( Aig_Man_t * p )
{
    Vec_Ptr_t * vMinCut;
    Aig_Obj_t * pObj;
    int Flow, FlowCur, RetValue, i;
    // find the max-flow
    Flow = 0;
    Aig_ManCleanData( p );
    Aig_ManIncrementTravId(p);
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !pObj->fMarkB )
            continue;
        assert( !pObj->fMarkA );
        if ( !Aig_ObjFanin0(pObj)->fMarkB )
        {
//printf( "%d ", Aig_ObjFanin0(pObj)->Id );
            FlowCur  = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin0(pObj) );
            Flow    += FlowCur;
            if ( FlowCur )
                Aig_ManIncrementTravId(p);
        }
        if ( Aig_ObjIsNode(pObj) && !Aig_ObjFanin1(pObj)->fMarkB )
        {
//printf( "%d ", Aig_ObjFanin1(pObj)->Id );
            FlowCur  = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin1(pObj) );
            Flow    += FlowCur;
            if ( FlowCur )
                Aig_ManIncrementTravId(p);
        }
    }
//printf( "\n" );

    // mark the nodes reachable from the latches
    Aig_ManIncrementTravId(p);
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !pObj->fMarkB )
            continue;
        assert( !pObj->fMarkA );
        if ( !Aig_ObjFanin0(pObj)->fMarkB )
        {
            RetValue = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin0(pObj) );
            assert( RetValue == 0 );
        }
        if ( Aig_ObjIsNode(pObj) && !Aig_ObjFanin1(pObj)->fMarkB )
        {
            RetValue = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin1(pObj) );
            assert( RetValue == 0 );
        }
    }
    // find the min-cut with the smallest volume
    vMinCut = Llb_ManFlowMinCut( p );
    assert( Vec_PtrSize(vMinCut) == Flow );
//printf( "%d ", Vec_PtrSize(vMinCut) );
    Llb_ManFlowUpdateCut( p, vMinCut );
//printf( "%d   ", Vec_PtrSize(vMinCut) );
    // verify the cut
    if ( !Llb_ManFlowVerifyCut(p, vMinCut) )
        printf( "Llb_ManFlow() error! The computed min-cut is not a cut!\n" );
//    Llb_ManFlowPrintCut( p, vMinCut );
    return vMinCut;
}